

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArgMaxLayerParams::SerializeWithCachedSizes
          (ArgMaxLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->removedim_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
    return;
  }
  return;
}

Assistant:

void ArgMaxLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArgMaxLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool removeDim = 2;
  if (this->removedim() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->removedim(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArgMaxLayerParams)
}